

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlTextConcat(xmlNodePtr node,xmlChar *content,int len)

{
  xmlChar *content_00;
  int iVar1;
  
  if (node != (xmlNodePtr)0x0) {
    if ((node->type < XML_DOCUMENT_NODE) &&
       ((0x198U >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
      iVar1 = 0;
      if (content != (xmlChar *)0x0) {
        content_00 = xmlStrncatNew(node->content,content,len);
        if (content_00 == (xmlChar *)0x0) {
          iVar1 = -1;
        }
        else {
          xmlTextSetContent(node,content_00);
        }
      }
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlTextConcat(xmlNodePtr node, const xmlChar *content, int len) {
    if (node == NULL)
        return(-1);

    if ((node->type != XML_TEXT_NODE) &&
        (node->type != XML_CDATA_SECTION_NODE) &&
	(node->type != XML_COMMENT_NODE) &&
	(node->type != XML_PI_NODE))
        return(-1);

    return(xmlTextAddContent(node, content, len));
}